

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O1

size_t __thiscall
s2coding::EncodedUintVector<unsigned_int>::lower_bound
          (EncodedUintVector<unsigned_int> *this,uint target)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  S2LogMessage SStack_18;
  
  if ((byte)(this->len_ - 5) < 0xfc) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
               ,0xfd,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: len_ >= 1 && len_ <= sizeof(T) ",0x2d);
LAB_001fd0d8:
    abort();
  }
  uVar1 = (ulong)this->size_;
  switch(this->len_) {
  case '\x01':
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        uVar2 = uVar1 + uVar3 >> 1;
        if ((byte)this->data_[uVar2] < target) {
          uVar3 = uVar2 + 1;
          uVar2 = uVar1;
        }
        uVar1 = uVar2;
      } while (uVar3 < uVar2);
      return uVar3;
    }
    break;
  case '\x02':
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        uVar2 = uVar1 + uVar3 >> 1;
        if (*(ushort *)(this->data_ + (uVar1 + uVar3 & 0xfffffffffffffffe)) < target) {
          uVar3 = uVar2 + 1;
          uVar2 = uVar1;
        }
        uVar1 = uVar2;
      } while (uVar3 < uVar2);
      return uVar3;
    }
    break;
  case '\x03':
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        uVar2 = uVar1 + uVar3 >> 1;
        if (CONCAT21(*(undefined2 *)(this->data_ + uVar2 * 3 + 1),this->data_[uVar2 * 3]) < target)
        {
          uVar3 = uVar2 + 1;
          uVar2 = uVar1;
        }
        uVar1 = uVar2;
      } while (uVar3 < uVar2);
      return uVar3;
    }
    break;
  case '\x04':
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        uVar2 = uVar1 + uVar3 >> 1;
        if (*(uint *)(this->data_ + uVar2 * 4) < target) {
          uVar3 = uVar2 + 1;
          uVar2 = uVar1;
        }
        uVar1 = uVar2;
      } while (uVar3 < uVar2);
      return uVar3;
    }
    break;
  default:
    if (uVar1 != 0) {
      S2LogMessage::S2LogMessage
                (&SStack_18,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
                 ,0x93,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (SStack_18.stream_,"Check failed: length >= 0 && length <= sizeof(T) ",0x31);
      goto LAB_001fd0d8;
    }
  }
  return 0;
}

Assistant:

size_t EncodedUintVector<T>::lower_bound(T target) const {
  static_assert(sizeof(T) & 0xe, "Unsupported integer length");
  S2_DCHECK(len_ >= 1 && len_ <= sizeof(T));

  // TODO(ericv): Consider using the unused 28 bits of "len_" to store the
  // last result of lower_bound() to be used as a hint.  This should help in
  // common situation where the same element is looked up repeatedly.  This
  // would require declaring the new field (length_lower_bound_hint_) as
  // mutable std::atomic<uint32> (accessed using std::memory_order_relaxed)
  // with a custom copy constructor that resets the hint component to zero.
  switch (len_) {
    case 1: return lower_bound<1>(target);
    case 2: return lower_bound<2>(target);
    case 3: return lower_bound<3>(target);
    case 4: return lower_bound<4>(target);
    case 5: return lower_bound<5>(target);
    case 6: return lower_bound<6>(target);
    case 7: return lower_bound<7>(target);
    default: return lower_bound<8>(target);
  }
}